

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileProfilingData.cxx
# Opt level: O2

void __thiscall cmMakefileProfilingData::StopEntry(cmMakefileProfilingData *this)

{
  StreamWriter *pSVar1;
  Value *pVVar2;
  long lVar3;
  longlong lVar4;
  Value v;
  SystemInformation info;
  Value local_90;
  Value local_60;
  SystemInformation local_30 [4];
  
  if (*(int *)(&(this->ProfileStream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x20
              + (long)(this->ProfileStream).super_basic_ostream<char,_std::char_traits<char>_>.
                      _vptr_basic_ostream[-3]) == 0) {
    std::operator<<((ostream *)this,",");
    cmsys::SystemInformation::SystemInformation(local_30);
    Json::Value::Value(&local_60,nullValue);
    Json::Value::Value(&local_90,"E");
    pVVar2 = Json::Value::operator[](&local_60,"ph");
    Json::Value::operator=(pVVar2,&local_90);
    Json::Value::~Value(&local_90);
    lVar3 = std::chrono::_V2::steady_clock::now();
    Json::Value::Value(&local_90,lVar3 / 1000);
    pVVar2 = Json::Value::operator[](&local_60,"ts");
    Json::Value::operator=(pVVar2,&local_90);
    Json::Value::~Value(&local_90);
    lVar4 = cmsys::SystemInformation::GetProcessId(local_30);
    Json::Value::Value(&local_90,(Int)lVar4);
    pVVar2 = Json::Value::operator[](&local_60,"pid");
    Json::Value::operator=(pVVar2,&local_90);
    Json::Value::~Value(&local_90);
    Json::Value::Value(&local_90,0);
    pVVar2 = Json::Value::operator[](&local_60,"tid");
    Json::Value::operator=(pVVar2,&local_90);
    Json::Value::~Value(&local_90);
    pSVar1 = (this->JsonWriter)._M_t.
             super___uniq_ptr_impl<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>.
             _M_t.
             super__Tuple_impl<0UL,_Json::StreamWriter_*,_std::default_delete<Json::StreamWriter>_>.
             super__Head_base<0UL,_Json::StreamWriter_*,_false>._M_head_impl;
    (*pSVar1->_vptr_StreamWriter[2])(pSVar1,&local_60,this);
    Json::Value::~Value(&local_60);
    cmsys::SystemInformation::~SystemInformation(local_30);
  }
  return;
}

Assistant:

void cmMakefileProfilingData::StopEntry()
{
  /* Do not try again if we previously failed to write to output. */
  if (!this->ProfileStream.good()) {
    return;
  }

  try {
    this->ProfileStream << ",";
    cmsys::SystemInformation info;
    Json::Value v;
    v["ph"] = "E";
    v["ts"] = static_cast<Json::Value::UInt64>(
      std::chrono::duration_cast<std::chrono::microseconds>(
        std::chrono::steady_clock::now().time_since_epoch())
        .count());
    v["pid"] = static_cast<int>(info.GetProcessId());
    v["tid"] = 0;
    this->JsonWriter->write(v, &this->ProfileStream);
  } catch (std::ios_base::failure& fail) {
    cmSystemTools::Error(
      cmStrCat("Failed to write to profiling output:", fail.what()));
  } catch (...) {
    cmSystemTools::Error("Error writing profiling output!");
  }
}